

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O1

sample_t * Timidity::resample_voice(Renderer *song,Voice *vp,int *countptr)

{
  float fVar1;
  float fVar2;
  ushort uVar3;
  Sample *pSVar4;
  sample_t *psVar5;
  int iVar6;
  uint uVar7;
  int incr;
  int iVar8;
  int iVar9;
  int iVar10;
  sample_t *psVar11;
  int iVar12;
  uint uVar13;
  int le_2;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  sample_t *psVar18;
  int iVar19;
  bool bVar20;
  int le;
  
  pSVar4 = vp->sample;
  if (pSVar4->sample_rate == 0) {
    iVar9 = vp->sample_offset >> 0xc;
    iVar6 = (pSVar4->data_length >> 0xc) - iVar9;
    if (*countptr < iVar6) {
      vp->sample_offset = *countptr * 0x1000 + vp->sample_offset;
    }
    else {
      vp->status = '\0';
      *countptr = iVar6;
    }
    psVar18 = pSVar4->data + iVar9;
  }
  else {
    uVar3 = pSVar4->modes;
    if (((vp->status & 0x10) != 0) && (pSVar4->loop_end - pSVar4->loop_start < 2)) {
      vp->status = vp->status & 0xef;
    }
    if (vp->vibrato_control_ratio == 0) {
      if ((vp->status & 0x10) == 0) {
        psVar18 = song->resample_buffer;
        psVar5 = pSVar4->data;
        uVar13 = vp->sample_offset;
        iVar9 = vp->sample_increment;
        uVar7 = pSVar4->data_length;
        iVar6 = -iVar9;
        if (0 < iVar9) {
          iVar6 = iVar9;
        }
        iVar9 = *countptr;
        iVar12 = (int)(uVar7 - uVar13) / iVar6;
        iVar16 = iVar12 + 1;
        iVar17 = iVar12 - iVar9;
        psVar11 = psVar18;
        if (iVar9 <= iVar12) {
          iVar16 = iVar9;
          iVar17 = -1;
        }
        for (; iVar12 = (int)uVar13 >> 0xc, iVar16 != 0; iVar16 = iVar16 + -1) {
          uVar15 = uVar13 & 0xfff;
          uVar13 = uVar13 + iVar6;
          *psVar11 = (float)uVar15 * 0.00024414062 * (psVar5[(long)iVar12 + 1] - psVar5[iVar12]) +
                     psVar5[iVar12];
          psVar11 = psVar11 + 1;
        }
        if ((int)uVar7 <= (int)uVar13) {
          if (uVar13 == uVar7) {
            *psVar11 = psVar5[iVar12];
          }
          vp->status = '\0';
          *countptr = iVar17 + iVar9;
        }
        vp->sample_offset = uVar13;
      }
      else {
        psVar18 = song->resample_buffer;
        iVar9 = *countptr;
        uVar13 = vp->sample_offset;
        iVar6 = vp->sample_increment;
        iVar12 = pSVar4->loop_start;
        iVar17 = pSVar4->loop_end;
        if ((uVar3 & 8) == 0) {
          if (iVar9 != 0) {
            psVar5 = pSVar4->data;
            psVar11 = psVar18;
            do {
              iVar16 = iVar12 - iVar17;
              if ((int)uVar13 < iVar17) {
                iVar16 = 0;
              }
              uVar13 = iVar16 + uVar13;
              iVar16 = (int)(iVar17 - uVar13) / iVar6;
              iVar8 = iVar16 + 1;
              iVar10 = iVar9 - iVar8;
              if (iVar9 <= iVar16) {
                iVar8 = iVar9;
                iVar10 = 0;
              }
              for (; iVar9 = iVar10, iVar8 != 0; iVar8 = iVar8 + -1) {
                iVar16 = (int)uVar13 >> 0xc;
                uVar7 = uVar13 & 0xfff;
                uVar13 = uVar13 + iVar6;
                fVar1 = psVar5[iVar16];
                *psVar11 = (float)uVar7 * 0.00024414062 * (psVar5[(long)iVar16 + 1] - fVar1) + fVar1
                ;
                psVar11 = psVar11 + 1;
                iVar10 = iVar9;
              }
            } while (iVar9 != 0);
          }
        }
        else {
          psVar5 = pSVar4->data;
          psVar11 = psVar18;
          if ((int)uVar13 <= iVar12) {
            iVar16 = (int)(iVar12 - uVar13) / iVar6;
            iVar10 = iVar9 - (iVar16 + 1);
            iVar8 = iVar9;
            if (iVar16 < iVar9) {
              iVar8 = iVar16 + 1;
            }
            bVar20 = iVar16 < iVar9;
            iVar9 = 0;
            if (bVar20) {
              iVar9 = iVar10;
            }
            for (; iVar8 != 0; iVar8 = iVar8 + -1) {
              *psVar11 = (float)(uVar13 & 0xfff) * 0.00024414062 *
                         (psVar5[(long)((int)uVar13 >> 0xc) + 1] - psVar5[(int)uVar13 >> 0xc]) +
                         psVar5[(int)uVar13 >> 0xc];
              uVar13 = uVar13 + iVar6;
              psVar11 = psVar11 + 1;
            }
          }
          while (iVar9 != 0) {
            iVar16 = iVar12;
            if (0 < iVar6) {
              iVar16 = iVar17;
            }
            iVar16 = (int)(iVar16 - uVar13) / iVar6;
            iVar8 = iVar16 + 1;
            iVar10 = iVar9 - iVar8;
            if (iVar9 <= iVar16) {
              iVar8 = iVar9;
              iVar10 = 0;
            }
            for (; iVar9 = iVar10, iVar8 != 0; iVar8 = iVar8 + -1) {
              iVar16 = (int)uVar13 >> 0xc;
              uVar7 = uVar13 & 0xfff;
              uVar13 = uVar13 + iVar6;
              *psVar11 = (float)uVar7 * 0.00024414062 * (psVar5[(long)iVar16 + 1] - psVar5[iVar16])
                         + psVar5[iVar16];
              psVar11 = psVar11 + 1;
              iVar10 = iVar9;
            }
            iVar16 = iVar17;
            if ((iVar17 <= (int)uVar13) || (iVar16 = iVar12, (int)uVar13 <= iVar12)) {
              uVar13 = iVar16 * 2 - uVar13;
              iVar6 = -iVar6;
            }
          }
          vp->sample_increment = iVar6;
        }
        vp->sample_offset = uVar13;
      }
    }
    else if ((vp->status & 0x10) == 0) {
      psVar18 = song->resample_buffer;
      fVar1 = song->rate;
      psVar5 = pSVar4->data;
      uVar13 = pSVar4->data_length;
      iVar9 = vp->sample_increment;
      iVar6 = -iVar9;
      if (0 < iVar9) {
        iVar6 = iVar9;
      }
      iVar9 = vp->vibrato_control_counter;
      iVar12 = *countptr + 1;
      psVar11 = psVar18;
      uVar7 = vp->sample_offset;
      do {
        if (iVar12 == 1) goto LAB_00353d3f;
        bVar20 = iVar9 == 0;
        iVar9 = iVar9 + -1;
        if (bVar20) {
          iVar9 = vp->vibrato_control_ratio;
          iVar6 = update_vibrato(fVar1,vp,0);
        }
        uVar15 = iVar6 + uVar7;
        *psVar11 = (float)(uVar7 & 0xfff) * 0.00024414062 *
                   (psVar5[(long)((int)uVar7 >> 0xc) + 1] - psVar5[(int)uVar7 >> 0xc]) +
                   psVar5[(int)uVar7 >> 0xc];
        psVar11 = psVar11 + 1;
        iVar12 = iVar12 + -1;
        uVar7 = uVar15;
      } while ((int)uVar15 < (int)uVar13);
      if (uVar15 == uVar13) {
        *psVar11 = psVar5[(int)uVar15 >> 0xc];
      }
      vp->status = '\0';
      *countptr = *countptr - iVar12;
LAB_00353d3f:
      vp->vibrato_control_counter = iVar9;
      vp->sample_increment = iVar6;
      vp->sample_offset = uVar7;
    }
    else {
      psVar18 = song->resample_buffer;
      fVar1 = song->rate;
      iVar9 = *countptr;
      uVar13 = vp->sample_offset;
      uVar7 = vp->sample_increment;
      iVar6 = pSVar4->loop_start;
      iVar12 = pSVar4->loop_end;
      if ((uVar3 & 8) == 0) {
        iVar17 = vp->vibrato_control_counter;
        if (iVar9 != 0) {
          psVar5 = pSVar4->data;
          psVar11 = psVar18;
          do {
            iVar16 = iVar6 - iVar12;
            if ((int)uVar13 < iVar12) {
              iVar16 = 0;
            }
            uVar13 = iVar16 + uVar13;
            iVar16 = (int)(iVar12 - uVar13) / (int)uVar7;
            iVar8 = iVar16 + 1;
            if (iVar9 <= iVar16) {
              iVar8 = iVar9;
            }
            iVar16 = iVar8;
            if (iVar17 < iVar8) {
              iVar16 = 0;
            }
            iVar10 = iVar17;
            iVar19 = iVar17;
            if (iVar8 < iVar17) {
              iVar10 = iVar8;
              iVar19 = iVar8;
            }
            for (; iVar10 != 0; iVar10 = iVar10 + -1) {
              iVar14 = (int)uVar13 >> 0xc;
              uVar15 = uVar13 & 0xfff;
              uVar13 = uVar13 + uVar7;
              fVar2 = psVar5[iVar14];
              *psVar11 = (float)uVar15 * 0.00024414062 * (psVar5[(long)iVar14 + 1] - fVar2) + fVar2;
              psVar11 = psVar11 + 1;
            }
            if (iVar17 < iVar8) {
              iVar17 = vp->vibrato_control_ratio;
              uVar7 = update_vibrato(fVar1,vp,0);
            }
            else {
              iVar17 = iVar17 - iVar16;
            }
            iVar9 = iVar9 - iVar19;
          } while (iVar9 != 0);
        }
        vp->vibrato_control_counter = iVar17;
      }
      else {
        psVar5 = pSVar4->data;
        iVar17 = vp->vibrato_control_counter;
        psVar11 = psVar18;
        if ((int)uVar13 <= iVar6 && iVar9 != 0) {
          do {
            iVar16 = (int)(iVar6 - uVar13) / (int)uVar7;
            iVar8 = iVar16 + 1;
            if (iVar9 <= iVar16) {
              iVar8 = iVar9;
            }
            iVar16 = iVar8;
            if (iVar17 < iVar8) {
              iVar16 = 0;
            }
            iVar10 = iVar17;
            iVar19 = iVar17;
            if (iVar8 < iVar17) {
              iVar10 = iVar8;
              iVar19 = iVar8;
            }
            for (; iVar10 != 0; iVar10 = iVar10 + -1) {
              iVar14 = (int)uVar13 >> 0xc;
              uVar15 = uVar13 & 0xfff;
              uVar13 = uVar13 + uVar7;
              *psVar11 = (float)uVar15 * 0.00024414062 * (psVar5[(long)iVar14 + 1] - psVar5[iVar14])
                         + psVar5[iVar14];
              psVar11 = psVar11 + 1;
            }
            if (iVar17 < iVar8) {
              iVar17 = vp->vibrato_control_ratio;
              uVar7 = update_vibrato(fVar1,vp,0);
            }
            else {
              iVar17 = iVar17 - iVar16;
            }
            iVar9 = iVar9 - iVar19;
          } while ((iVar9 != 0) && ((int)uVar13 <= iVar6));
        }
        for (; iVar9 != 0; iVar9 = iVar9 - iVar19) {
          iVar16 = iVar6;
          if (0 < (int)uVar7) {
            iVar16 = iVar12;
          }
          iVar16 = (int)(iVar16 - uVar13) / (int)uVar7;
          iVar8 = iVar16 + 1;
          if (iVar9 <= iVar16) {
            iVar8 = iVar9;
          }
          iVar16 = iVar8;
          if (iVar17 < iVar8) {
            iVar16 = 0;
          }
          iVar10 = iVar17;
          iVar19 = iVar17;
          if (iVar8 < iVar17) {
            iVar10 = iVar8;
            iVar19 = iVar8;
          }
          for (; iVar10 != 0; iVar10 = iVar10 + -1) {
            iVar14 = (int)uVar13 >> 0xc;
            uVar15 = uVar13 & 0xfff;
            uVar13 = uVar13 + uVar7;
            *psVar11 = (float)uVar15 * 0.00024414062 * (psVar5[(long)iVar14 + 1] - psVar5[iVar14]) +
                       psVar5[iVar14];
            psVar11 = psVar11 + 1;
          }
          if (iVar17 < iVar8) {
            iVar17 = vp->vibrato_control_ratio;
            uVar7 = update_vibrato(fVar1,vp,uVar7 >> 0x1f);
          }
          else {
            iVar17 = iVar17 - iVar16;
          }
          iVar16 = iVar12;
          if ((iVar12 <= (int)uVar13) || (iVar16 = iVar6, (int)uVar13 <= iVar6)) {
            uVar13 = iVar16 * 2 - uVar13;
            uVar7 = -uVar7;
          }
        }
        vp->vibrato_control_counter = iVar17;
      }
      vp->sample_increment = uVar7;
      vp->sample_offset = uVar13;
    }
  }
  return psVar18;
}

Assistant:

sample_t *resample_voice(Renderer *song, Voice *vp, int *countptr)
{
	int ofs;
	WORD modes;

	if (vp->sample->sample_rate == 0)
	{
		/* Pre-resampled data -- just update the offset and check if
		we're out of data. */
		ofs = vp->sample_offset >> FRACTION_BITS; /* Kind of silly to use FRACTION_BITS here... */
		if (*countptr >= (vp->sample->data_length >> FRACTION_BITS) - ofs)
		{
			/* Note finished. Free the voice. */
			vp->status = 0;

			/* Let the caller know how much data we had left */
			*countptr = (vp->sample->data_length >> FRACTION_BITS) - ofs;
		}
		else
		{
			vp->sample_offset += *countptr << FRACTION_BITS;
		}
		return vp->sample->data + ofs;
	}

	/* Need to resample. Use the proper function. */
	modes = vp->sample->modes;

	if (vp->status & VOICE_LPE)
	{
		if (vp->sample->loop_end - vp->sample->loop_start < 2)
		{ // Loop is too short; turn it off.
			vp->status &= ~VOICE_LPE;
		}
	}

	if (vp->vibrato_control_ratio)
	{
		if (vp->status & VOICE_LPE)
		{
			if (modes & PATCH_BIDIR)
				return rs_vib_bidir(song->resample_buffer, song->rate, vp, *countptr);
			else
				return rs_vib_loop(song->resample_buffer, song->rate, vp, *countptr);
		}
		else
		{
			return rs_vib_plain(song->resample_buffer, song->rate, vp, countptr);
		}
	}
	else
	{
		if (vp->status & VOICE_LPE)
		{
			if (modes & PATCH_BIDIR)
				return rs_bidir(song->resample_buffer, vp, *countptr);
			else
				return rs_loop(song->resample_buffer, vp, *countptr);
		}
		else
		{
			return rs_plain(song->resample_buffer, vp, countptr);
		}
	}
}